

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_rpc_server::main(json_rpc_server *this,string param_1)

{
  bool bVar1;
  char cVar2;
  level_type lVar3;
  _Rb_tree_color _Var4;
  request *this_00;
  response *prVar5;
  ostream *poVar6;
  json_call *this_01;
  context *c;
  iterator iVar7;
  array *__args;
  application local_80;
  string local_50;
  
  if ((this->smd_)._M_string_length != 0) {
    this_00 = application::request(&this->super_application);
    http::request::request_method_abi_cxx11_((string *)&local_80,this_00);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_80,"GET");
    std::__cxx11::string::~string((string *)&local_80);
    if (bVar1) {
      prVar5 = application::response(&this->super_application);
      std::__cxx11::string::string((string *)&local_80,"application/json",(allocator *)&local_50);
      http::response::set_content_header(prVar5,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      prVar5 = application::response(&this->super_application);
      poVar6 = http::response::out(prVar5);
      std::operator<<(poVar6,(string *)&this->smd_);
      bVar1 = application::is_asynchronous(&this->super_application);
      if (!bVar1) {
        return;
      }
      application::release_context(&local_80);
      http::context::async_complete_response((context *)local_80._vptr_application);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_80.d);
      return;
    }
  }
  this_01 = (json_call *)operator_new(0x60);
  c = application::context(&this->super_application);
  json_call::json_call(this_01,c);
  std::__shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>::
  reset<cppcms::rpc::json_call>
            (&(this->current_call_).
              super___shared_ptr<cppcms::rpc::json_call,_(__gnu_cxx::_Lock_policy)2>,this_01);
  lVar3 = booster::log::logger::instance();
  cVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x46);
  if (cVar2 != '\0') {
    booster::log::message::message
              ((message *)&local_80,debug,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/rpc_json.cpp"
               ,0xa2);
    poVar6 = (ostream *)booster::log::message::out();
    poVar6 = std::operator<<(poVar6,"JSON-RPC Method call:");
    method_abi_cxx11_(&local_50,this);
    std::operator<<(poVar6,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    booster::log::message::~message((message *)&local_80);
  }
  method_abi_cxx11_((string *)&local_80,this);
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::rpc::json_rpc_server::method_data>_>_>
          ::find(&(this->methods_)._M_t,(key_type *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if ((_Rb_tree_header *)iVar7._M_node == &(this->methods_)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = notification(this);
    if (bVar1) {
      return;
    }
    json::value::value<char[17]>((value *)&local_80,(char (*) [17])"Method not found");
    return_error(this,(value *)&local_80);
LAB_0023f83f:
    json::value::copyable::~copyable((copyable *)&local_80);
  }
  else {
    _Var4 = iVar7._M_node[3]._M_color;
    if (_Var4 == 2) {
      bVar1 = notification(this);
      if (!bVar1) {
        json::value::value<char[35]>
                  ((value *)&local_80,(char (*) [35])"The request should be notification");
        return_error(this,(value *)&local_80);
        goto LAB_0023f83f;
      }
      _Var4 = iVar7._M_node[3]._M_color;
    }
    if ((_Var4 == _S_black) && (bVar1 = notification(this), bVar1)) {
      return;
    }
    __args = params(this);
    std::
    function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
    ::operator()((function<void_(const_std::vector<cppcms::json::value,_std::allocator<cppcms::json::value>_>_&)>
                  *)(iVar7._M_node + 2),__args);
  }
  return;
}

Assistant:

void json_rpc_server::main(std::string /*unused*/)
	{
		if(!smd_.empty() && request().request_method()=="GET") {

			response().set_content_header("application/json");
			response().out() << smd_;

			if(is_asynchronous())
				release_context()->async_complete_response();
			return;
		}

		try {
			current_call_.reset(new json_call(context()));
			BOOSTER_DEBUG("cppcms") << "JSON-RPC Method call:" << method();
			methods_map_type::iterator p=methods_.find(method());
			if(p==methods_.end()) {
				if(!notification())
					return_error("Method not found");
				return;
			}
			if(p->second.role == notification_role && !notification()) {
				return_error("The request should be notification");
				return;
			}
			if(p->second.role == method_role && notification()) {
				// No way to respond according to protocol
				return;
			}
			try {
				p->second.method(params());
			}
			catch(json::bad_value_cast const &e) {
				if(current_call_.get() && !notification())
					return_error("Invalid parameters");
				return;
			}
			catch(call_error const &e) {
				if(current_call_.get() && !notification())
					return_error(e.what());
				return;
			}
			catch(std::exception const &e) {
				if(current_call_.get() && !notification())
					return_error("Internal Service Error");
				return;
			}
		}
		catch(call_error const &e)
		{
			response().set_content_header("text/plain");
			response().out()<< e.what() << std::endl;
		}
	}